

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb)

{
  cmFunctionBlocker *this_00;
  bool bVar1;
  cmListFileContext local_60;
  cmFunctionBlocker *local_18;
  cmFunctionBlocker *fb_local;
  cmMakefile *this_local;
  
  local_18 = fb;
  fb_local = (cmFunctionBlocker *)this;
  bVar1 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
          empty(&this->CallStack);
  this_00 = local_18;
  if (!bVar1) {
    GetExecutionContext(&local_60,this);
    cmFunctionBlocker::SetStartingContext(this_00,&local_60);
    cmListFileContext::~cmListFileContext(&local_60);
  }
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::push_back
            (&this->FunctionBlockers,&local_18);
  return;
}

Assistant:

void cmMakefile::AddFunctionBlocker(cmFunctionBlocker* fb)
{
  if(!this->CallStack.empty())
    {
    // Record the context in which the blocker is created.
    fb->SetStartingContext(this->GetExecutionContext());
    }

  this->FunctionBlockers.push_back(fb);
}